

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void math::wide_integer::uintwide_t<16384u,unsigned_int,std::allocator<unsigned_int>,false>::
     eval_multiply_n_by_n_to_2n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>
               (uint *r,uint *a,uint *b,unsigned_fast_type count)

{
  unsigned_fast_type i;
  unsigned_fast_type uVar1;
  long lVar2;
  ulong uVar3;
  unsigned_fast_type j;
  unsigned_fast_type uVar4;
  
  for (lVar2 = 0; (long)((int)count * 2) * 4 != lVar2; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)r + lVar2) = 0;
  }
  for (uVar1 = 0; uVar1 != count; uVar1 = uVar1 + 1) {
    if (*a != 0) {
      uVar3 = 0;
      for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
        uVar3 = uVar3 + r[uVar4] + (ulong)b[uVar4] * (ulong)*a;
        r[uVar4] = (uint)uVar3;
        uVar3 = uVar3 >> 0x20;
      }
      r[uVar4] = (uint)uVar3;
    }
    a = a + 1;
    r = r + 1;
  }
  return;
}

Assistant:

static constexpr auto eval_multiply_n_by_n_to_2n(      ResultIterator     r,
                                                           InputIteratorLeft  a,
                                                           InputIteratorRight b,
                                                     const unsigned_fast_type count) -> void
    {
      static_assert
      (
           (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorLeft>::value_type>::digits)
        && (std::numeric_limits<typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type>::digits == std::numeric_limits<typename detail::iterator_detail::iterator_traits<InputIteratorRight>::value_type>::digits),
        "Error: Internals require same widths for left-right-result limb_types at the moment"
      );

      using local_limb_type = typename detail::iterator_detail::iterator_traits<ResultIterator>::value_type;

      using local_double_limb_type =
        typename detail::uint_type_helper<static_cast<size_t>(std::numeric_limits<local_limb_type>::digits * 2)>::exact_unsigned_type;

      detail::fill_unsafe(r, detail::advance_and_point(r, static_cast<size_t>(count * 2U)), static_cast<local_limb_type>(UINT8_C(0)));

      for(auto i = static_cast<unsigned_fast_type>(UINT8_C(0)); i < count; ++i)
      {
        if(*a != static_cast<local_limb_type>(UINT8_C(0)))
        {
          auto carry = static_cast<local_double_limb_type>(UINT8_C(0));

          auto r_i_plus_j = detail::advance_and_point(r, i); // NOLINT(llvm-qualified-auto,readability-qualified-auto)
          auto bj         = b;                               // NOLINT(llvm-qualified-auto,readability-qualified-auto)

          for(auto j = static_cast<unsigned_fast_type>(UINT8_C(0)); j < count; ++j)
          {
            carry =
              static_cast<local_double_limb_type>
              (
                  static_cast<local_double_limb_type>
                  (
                      carry
                    + static_cast<local_double_limb_type>(static_cast<local_double_limb_type>(*a) * *bj++)
                  )
                + *r_i_plus_j
              );

            *r_i_plus_j++ = static_cast<local_limb_type>(carry);
            carry         = detail::make_hi<local_limb_type>(carry);
          }

          *r_i_plus_j = static_cast<local_limb_type>(carry);
        }

        ++a;
      }
    }